

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

void Aig_ObjComputeCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  int iVar3;
  Aig_Cut_t *pCut;
  void *pvVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Aig_Cut_t *pCut1;
  Aig_Cut_t *pAVar9;
  long lVar10;
  bool bVar11;
  Aig_Cut_t *local_50;
  
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                  ,0x247,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  if (p->pCuts[pObj->Id] != (Aig_Cut_t *)0x0) {
    __assert_fail("Aig_ObjCuts(p, pObj) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                  ,0x248,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  pAVar1 = pObj->pFanin0;
  pAVar2 = pObj->pFanin1;
  Aig_ObjPrepareCuts(p,pObj,fTriv);
  local_50 = p->pCuts[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)];
  iVar7 = p->nCutsMax;
  iVar6 = 0;
  do {
    if (iVar7 <= iVar6) {
      return;
    }
    if ('\0' < local_50->nFanins) {
      pCut1 = p->pCuts[*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)];
      for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
        if (('\0' < pCut1->nFanins) &&
           (iVar3 = Kit_WordCountOnes(pCut1->uSign | local_50->uSign), iVar3 <= p->nLeafMax)) {
          pCut = p->pCuts[pObj->Id];
          pAVar9 = (Aig_Cut_t *)0x0;
          while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
            if (pCut->nFanins == '\0') goto LAB_0051a98d;
            if ((pAVar9 == (Aig_Cut_t *)0x0) || (pAVar9->Cost < pCut->Cost)) {
              pAVar9 = pCut;
            }
            pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
          }
          if (pAVar9 == (Aig_Cut_t *)0x0) {
            __assert_fail("pCutMax != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                          ,0xe8,"Aig_Cut_t *Aig_CutFindFree(Aig_ManCut_t *, Aig_Obj_t *)");
          }
          pAVar9->nFanins = '\0';
          pCut = pAVar9;
LAB_0051a98d:
          iVar7 = Aig_CutMerge(p,local_50,pCut1,pCut);
          if (iVar7 == 0) {
            if (pCut->nFanins != '\0') {
              __assert_fail("pCut->nFanins == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                            ,0x259,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
            }
          }
          else {
            iVar7 = Aig_CutFilter(p,pObj,pCut);
            if (iVar7 == 0) {
              if (p->fTruth != 0) {
                Aig_CutComputeTruth(p,pCut,local_50,pCut1,*(uint *)&pObj->pFanin0 & 1,
                                    *(uint *)&pObj->pFanin1 & 1);
              }
              cVar5 = pCut->nFanins;
              if (cVar5 < '\x01') {
                __assert_fail("pCut->nFanins > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0xb5,"int Aig_CutFindCost(Aig_ManCut_t *, Aig_Cut_t *)");
              }
              lVar10 = 0;
              iVar7 = 0;
              while ((lVar10 < cVar5 && (p_00 = p->pAig->vObjs, p_00 != (Vec_Ptr_t *)0x0))) {
                pvVar4 = Vec_PtrEntry(p_00,*(int *)((long)&pCut[1].pNext + lVar10 * 4));
                cVar5 = pCut->nFanins;
                if (pvVar4 == (void *)0x0) break;
                iVar7 = iVar7 + (*(uint *)((long)pvVar4 + 0x18) >> 6);
                lVar10 = lVar10 + 1;
              }
              iVar7 = (iVar7 * 1000) / (int)cVar5;
              pCut->Cost = iVar7;
              if (cVar5 < '\x01') {
                __assert_fail("pCut->nFanins > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x267,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
              if (iVar7 < 1) {
                __assert_fail("pCut->Cost > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x268,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
            else if (pCut->nFanins != '\0') {
              __assert_fail("pCut->nFanins == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                            ,0x25f,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
            }
          }
        }
        pCut1 = (Aig_Cut_t *)((long)&pCut1->pNext + (long)pCut1->nCutSize);
        iVar7 = p->nCutsMax;
      }
    }
    iVar6 = iVar6 + 1;
    local_50 = (Aig_Cut_t *)((long)&local_50->pNext + (long)local_50->nCutSize);
  } while( true );
}

Assistant:

void Aig_ObjComputeCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    int i, k;
    // the node is not processed yet
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjCuts(p, pObj) == NULL );
    // set up the first cut
    pCutSet = Aig_ObjPrepareCuts( p, pObj, fTriv );
    // compute pair-wise cut combinations while checking table
    Aig_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Aig_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Aig_CutFindFree( p, pObj );
        // assemble the new cut
        if ( !Aig_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Aig_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        if ( p->fTruth )
            Aig_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // assign the cost
        pCut->Cost = Aig_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
}